

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O1

void de::anon_unknown_0::multiThreadTest(int numThreads)

{
  long *plVar1;
  ulong uVar2;
  deUint32 dVar3;
  void *__s;
  Thread *this;
  ulong uVar4;
  ulong uVar5;
  deInt32 sharedVar;
  SpinBarrier barrier;
  int local_54;
  ulong local_50;
  deUint32 local_44;
  int local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar2 = (ulong)(uint)numThreads;
  local_44 = deGetNumAvailableLogicalCores();
  local_3c = 0;
  local_38 = 0;
  local_34 = 0;
  local_54 = 0;
  uVar5 = uVar2 * 8;
  local_40 = numThreads;
  __s = operator_new(uVar5);
  if (numThreads != 0) {
    memset(__s,0,uVar5);
  }
  local_50 = uVar5;
  if (0 < numThreads) {
    uVar5 = 0;
    do {
      this = (Thread *)operator_new(0x38);
      Thread::Thread(this);
      this->_vptr_Thread = (_func_int **)&PTR__Thread_00d4bb88;
      this[1]._vptr_Thread = (_func_int **)&local_44;
      *(int **)&this[1].m_attribs = &local_54;
      *(int *)&this[1].m_thread = numThreads;
      *(int *)((long)&this[1].m_thread + 4) = (int)uVar5;
      dVar3 = deGetNumAvailableLogicalCores();
      *(bool *)&this[2]._vptr_Thread = (uint)numThreads <= dVar3;
      *(Thread **)((long)__s + uVar5 * 8) = this;
      Thread::start(this);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  uVar5 = local_50;
  if (0 < numThreads) {
    uVar4 = 0;
    do {
      Thread::join(*(Thread **)((long)__s + uVar4 * 8));
      plVar1 = *(long **)((long)__s + uVar4 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (local_54 != 0) {
    deAssertFail("sharedVar == 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                 ,0xfd);
  }
  operator_delete(__s,uVar5);
  return;
}

Assistant:

void multiThreadTest (int numThreads)
{
	SpinBarrier					barrier		(numThreads);
	volatile deInt32			sharedVar	= 0;
	std::vector<TestThread*>	threads		(numThreads, static_cast<TestThread*>(DE_NULL));

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx] = new TestThread(barrier, &sharedVar, numThreads, ndx);
		DE_TEST_ASSERT(threads[ndx]);
		threads[ndx]->start();
	}

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx]->join();
		delete threads[ndx];
	}

	DE_TEST_ASSERT(sharedVar == 0);
}